

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall
cmTarget::InsertInclude(cmTarget *this,string *entry,cmListFileBacktrace *bt,bool before)

{
  cmTargetInternals *pcVar1;
  const_iterator local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_48;
  const_iterator local_40;
  __normal_iterator<cmListFileBacktrace_*,_std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>_>
  local_38;
  iterator btPosition;
  iterator position;
  bool before_local;
  cmListFileBacktrace *bt_local;
  string *entry_local;
  cmTarget *this_local;
  
  if (before) {
    pcVar1 = cmTargetInternalPointer::operator->(&this->Internal);
    btPosition._M_current =
         (cmListFileBacktrace *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&pcVar1->IncludeDirectoriesEntries);
    pcVar1 = cmTargetInternalPointer::operator->(&this->Internal);
    local_38._M_current =
         (cmListFileBacktrace *)
         std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::begin
                   (&pcVar1->IncludeDirectoriesBacktraces);
  }
  else {
    pcVar1 = cmTargetInternalPointer::operator->(&this->Internal);
    btPosition._M_current =
         (cmListFileBacktrace *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&pcVar1->IncludeDirectoriesEntries);
    pcVar1 = cmTargetInternalPointer::operator->(&this->Internal);
    local_38._M_current =
         (cmListFileBacktrace *)
         std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::end
                   (&pcVar1->IncludeDirectoriesBacktraces);
  }
  pcVar1 = cmTargetInternalPointer::operator->(&this->Internal);
  __gnu_cxx::
  __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
  ::__normal_iterator<std::__cxx11::string*>
            ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              *)&local_40,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&btPosition);
  local_48 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::insert(&pcVar1->IncludeDirectoriesEntries,local_40,entry);
  pcVar1 = cmTargetInternalPointer::operator->(&this->Internal);
  __gnu_cxx::
  __normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>
  ::__normal_iterator<cmListFileBacktrace*>
            ((__normal_iterator<cmListFileBacktrace_const*,std::vector<cmListFileBacktrace,std::allocator<cmListFileBacktrace>>>
              *)&local_50,&local_38);
  std::vector<cmListFileBacktrace,_std::allocator<cmListFileBacktrace>_>::insert
            (&pcVar1->IncludeDirectoriesBacktraces,local_50,bt);
  return;
}

Assistant:

void cmTarget::InsertInclude(std::string const& entry,
                             cmListFileBacktrace const& bt,
                             bool before)
{
  std::vector<std::string>::iterator position =
      before ? this->Internal->IncludeDirectoriesEntries.begin()
             : this->Internal->IncludeDirectoriesEntries.end();

  std::vector<cmListFileBacktrace>::iterator btPosition =
      before ? this->Internal->IncludeDirectoriesBacktraces.begin()
             : this->Internal->IncludeDirectoriesBacktraces.end();

  this->Internal->IncludeDirectoriesEntries.insert(position, entry);
  this->Internal->IncludeDirectoriesBacktraces.insert(btPosition, bt);
}